

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O2

_Bool build_moria(chunk *c,loc_conflict centre,wchar_t rating)

{
  wchar_t wVar1;
  bool bVar2;
  bool bVar3;
  _Bool _Var4;
  uint32_t uVar5;
  uint32_t uVar6;
  int iVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  wchar_t *pwVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  int iVar13;
  wchar_t wVar14;
  wchar_t h;
  wchar_t w;
  wchar_t wVar15;
  loc_conflict centre_local;
  
  wVar1 = c->depth;
  centre_local = centre;
  uVar5 = Rand_div(0x23);
  uVar6 = Rand_div(5);
  h = uVar6 + L'\b';
  uVar6 = Rand_div(5);
  w = uVar6 + L'\n';
  bVar2 = true;
  do {
    if ((bVar2) && (uVar6 = Rand_div(0xf), uVar6 == 0)) {
      uVar6 = Rand_div(2);
      h = h * (uVar6 + 2);
      uVar6 = Rand_div(3);
      iVar7 = uVar6 + 3;
LAB_001537be:
      w = w * iVar7;
    }
    else {
      uVar6 = Rand_div(4);
      if (uVar6 != 0) {
        uVar6 = Rand_div(0xf);
        if (uVar6 != 0) {
          uVar6 = Rand_div(3);
          iVar7 = uVar6 + 2;
          goto LAB_001537be;
        }
        uVar6 = Rand_div(2);
        h = h * (uVar6 + 2);
      }
    }
    iVar7 = centre_local.y;
    if ((centre_local.y < c->height) && (iVar13 = centre_local.x, centre_local.x < c->width)) {
      event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,h,w);
LAB_0015383e:
      wVar12 = h / -2 + iVar7;
      wVar15 = w / -2 + iVar13;
      wVar14 = h + L'\xffffffff' + wVar12;
      wVar11 = w + wVar15 + L'\xffffffff';
      _Var4 = generate_starburst_room
                        (c,wVar12,wVar15,wVar14,wVar11,wVar1 <= uVar5 + L'\x01',FEAT_FLOOR,true);
      if (!_Var4) {
        return false;
      }
      uVar5 = Rand_div(0x14);
      if (uVar5 == 0) {
        event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"rubble");
        uVar5 = Rand_div(h / 4);
        wVar12 = wVar12 + uVar5;
        uVar5 = Rand_div(w / 4);
        wVar15 = wVar15 + uVar5;
        uVar5 = Rand_div(h / 4);
        wVar14 = wVar14 - uVar5;
        uVar5 = Rand_div(w / 4);
        wVar11 = wVar11 - uVar5;
        pwVar10 = &FEAT_PASS_RUBBLE;
      }
      else {
        uVar5 = Rand_div(0x32);
        if (uVar5 == 0) {
          event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"trees");
          uVar5 = Rand_div(h / 4);
          wVar12 = wVar12 + uVar5;
          uVar5 = Rand_div(w / 4);
          wVar15 = wVar15 + uVar5;
          uVar5 = Rand_div(h / 4);
          wVar14 = wVar14 - uVar5;
          uVar5 = Rand_div(w / 4);
          wVar11 = wVar11 - uVar5;
          pwVar10 = &FEAT_TREE;
        }
        else {
          uVar5 = Rand_div(0x32);
          if (uVar5 != 0) {
            uVar5 = Rand_div(10);
            if (uVar5 == 0) {
              event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"water");
              uVar5 = Rand_div(h / 4);
              uVar6 = Rand_div(w / 4);
              uVar8 = Rand_div(h / 4);
              uVar9 = Rand_div(w / 4);
              generate_starburst_room
                        (c,wVar12 + uVar5,wVar15 + uVar6,wVar14 - uVar8,wVar11 - uVar9,false,
                         FEAT_WATER,false);
              return true;
            }
            return true;
          }
          event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"trees");
          uVar5 = Rand_div(h / 4);
          wVar12 = wVar12 + uVar5;
          uVar5 = Rand_div(w / 4);
          wVar15 = wVar15 + uVar5;
          uVar5 = Rand_div(h / 4);
          wVar14 = wVar14 - uVar5;
          uVar5 = Rand_div(w / 4);
          wVar11 = wVar11 - uVar5;
          pwVar10 = &FEAT_TREE2;
        }
      }
      generate_starburst_room(c,wVar12,wVar15,wVar14,wVar11,false,*pwVar10,false);
      return true;
    }
    _Var4 = find_space(&centre_local,h,w);
    if (_Var4) {
      event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,h,w);
      iVar7 = centre_local.y;
      iVar13 = centre_local.x;
      goto LAB_0015383e;
    }
    bVar3 = !bVar2;
    bVar2 = false;
    if (bVar3) {
      event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,h,w);
      return false;
    }
  } while( true );
}

Assistant:

bool build_moria(struct chunk *c, struct loc centre, int rating)
{
	int y1, x1, y2, x2;
	int i;
	int height, width;

	bool light = c->depth <= randint1(35);

	/* Pick a room size */
	height = 8 + randint0(5);
	width = 10 + randint0(5);


	/* Try twice to find space for a room. */
	for (i = 0; i < 2; i++) {
		/* Really large room - only on first try. */
		if ((i == 0) && one_in_(15)) {
			height *= 1 + randint1(2);
			width *= 2 + randint1(3);
		}

		/* Long, narrow room.  Sometimes tall and thin. */
		else if (!one_in_(4)) {
			if (one_in_(15))
				height *= 2 + randint0(2);
			else
				width *= 2 + randint0(3);
		}

		/* Find and reserve some space in the dungeon.  Get center of room. */
		if ((centre.y >= c->height) || (centre.x >= c->width)) {
			if (!find_space(&centre, height, width)) {
				if (i == 0) continue;  /* Failed first attempt */
				event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,
					height, width);
				if (i == 1) return (false);  /* Failed second attempt */
			} else {
				event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,
					height, width);
				break;  /* Success */
			}
		} else {
			event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,
				height, width);
			break;   /* Not finding space */
		}
	}

	/* Locate the room */
	y1 = centre.y - height / 2;
	x1 = centre.x - width / 2;
	y2 = y1 + height - 1;
	x2 = x1 + width - 1;


	/* Generate starburst room.  Return immediately if out of bounds. */
	if (!generate_starburst_room(c, y1, x1, y2, x2, light, FEAT_FLOOR, true)) {
		return (false);
	}

	/* Sometimes, the room may have rubble, trees or water in it. */
	if (one_in_(20)) {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "rubble");
		(void) generate_starburst_room(c, y1 + randint0(height / 4),
									   x1 + randint0(width / 4),
									   y2 - randint0(height / 4),
									   x2 - randint0(width / 4), false,
									   FEAT_PASS_RUBBLE, false);
	} else if (one_in_(50)) {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "trees");
		(void) generate_starburst_room(c, y1 + randint0(height / 4),
									   x1 + randint0(width / 4),
									   y2 - randint0(height / 4),
									   x2 - randint0(width / 4), false,
									   FEAT_TREE, false);
	} else if (one_in_(50)) {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "trees");
		(void) generate_starburst_room(c, y1 + randint0(height / 4),
									   x1 + randint0(width / 4),
									   y2 - randint0(height / 4),
									   x2 - randint0(width / 4), false,
									   FEAT_TREE2, false);
	} else if (one_in_(10)) {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "water");
		(void) generate_starburst_room(c, y1 + randint0(height / 4),
									   x1 + randint0(width / 4),
									   y2 - randint0(height / 4),
									   x2 - randint0(width / 4), false,
									   FEAT_WATER, false);
	}

	/* Success */
	return (true);
}